

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O0

unsigned_short protodec_sdlc_crc(uchar *data,uint len)

{
  uint uVar1;
  byte *pbVar2;
  ushort local_18;
  ushort local_16;
  uint local_14;
  unsigned_short crc;
  unsigned_short c;
  uint len_local;
  uchar *data_local;
  
  local_18 = 0xffff;
  local_14 = len;
  _crc = data;
  while (uVar1 = local_14 - 1, local_14 != 0) {
    pbVar2 = _crc + 1;
    for (local_16 = *_crc + 0x100; local_14 = uVar1, _crc = pbVar2, 1 < local_16;
        local_16 = (ushort)((int)(uint)local_16 >> 1)) {
      if (((local_18 ^ local_16) & 1) == 0) {
        local_18 = (ushort)((int)(uint)local_18 >> 1);
      }
      else {
        local_18 = (ushort)((int)(uint)local_18 >> 1) ^ 0x8408;
      }
    }
  }
  return local_18 ^ 0xffff;
}

Assistant:

unsigned short protodec_sdlc_crc(const unsigned char *data, unsigned len)
{
	unsigned short c, crc = 0xffff;

	while (len--)
		for (c = 0x100 + *data++; c > 1; c >>= 1)
			if ((crc ^ c) & 1)
				crc = (crc >> 1) ^ 0x8408;
			else
				crc >>= 1;
	return ~crc;

}